

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O1

bool __thiscall cursespp::ScrollableWindow::IsLastItemVisible(ScrollableWindow *this)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar3;
  ulong *puVar2;
  
  iVar1 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x43])();
  puVar2 = (ulong *)CONCAT44(extraout_var,iVar1);
  uVar3 = 0;
  if (puVar2[3] != 0) {
    uVar3 = puVar2[3] - 1;
  }
  return uVar3 <= puVar2[1] + *puVar2 && *puVar2 <= uVar3;
}

Assistant:

bool ScrollableWindow::IsLastItemVisible() {
    ScrollPos &pos = this->GetMutableScrollPosition();

    size_t lastIndex = pos.totalEntries;
    lastIndex = (lastIndex == 0) ? lastIndex : lastIndex - 1;

    size_t firstVisible = pos.firstVisibleEntryIndex;
    size_t lastVisible = firstVisible + pos.visibleEntryCount;
    return lastIndex >= firstVisible && lastIndex <= lastVisible;
}